

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree.cxx
# Opt level: O2

int __thiscall
Fl_Tree::item_pathname(Fl_Tree *this,char *pathname,int pathnamelen,Fl_Tree_Item *item)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  
  *pathname = '\0';
  if (item == (Fl_Tree_Item *)0x0) {
    item = this->_root;
  }
  if (item == (Fl_Tree_Item *)0x0) {
    iVar6 = -1;
  }
  else {
    iVar6 = -2;
    if (1 < pathnamelen) {
      pcVar8 = pathname + ((ulong)(uint)pathnamelen - 2);
      pathname[(ulong)(uint)pathnamelen - 1] = '\0';
      iVar6 = 1;
      while ((pcVar3 = "???", item != (Fl_Tree_Item *)0x0 &&
             ((item->_parent != (Fl_Tree_Item *)0x0 || ((this->_prefs)._showroot != '\0'))))) {
        pcVar2 = Fl_Tree_Item::label(item);
        if (pcVar2 != (char *)0x0) {
          pcVar3 = Fl_Tree_Item::label(item);
        }
        sVar4 = strlen(pcVar3);
        iVar7 = iVar6;
        for (uVar5 = sVar4 & 0xffffffff; iVar6 = iVar7 + 1, 0 < (int)uVar5; uVar5 = uVar5 - 1) {
          if (pathnamelen <= iVar6) goto LAB_001d4d36;
          cVar1 = pcVar3[uVar5 - 1];
          *pcVar8 = cVar1;
          if ((cVar1 == '/') || (cVar1 == '\\')) {
            iVar6 = iVar7 + 2;
            if (pathnamelen <= iVar6) goto LAB_001d4d36;
            pcVar8[-1] = '\\';
            pcVar8 = pcVar8 + -2;
          }
          else {
            pcVar8 = pcVar8 + -1;
          }
          iVar7 = iVar6;
        }
        if (pathnamelen <= iVar6) {
LAB_001d4d36:
          *pathname = '\0';
          return -2;
        }
        *pcVar8 = '/';
        pcVar8 = pcVar8 + -1;
        item = item->_parent;
      }
      pcVar3 = pcVar8 + 2;
      if (pcVar8[1] != '/') {
        pcVar3 = pcVar8 + 1;
      }
      if (pcVar3 != pathname) {
        memmove(pathname,pcVar3,(long)(int)(iVar6 - (uint)(pcVar8[1] == '/')));
      }
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int Fl_Tree::item_pathname(char *pathname, int pathnamelen, const Fl_Tree_Item *item) const {
  pathname[0] = '\0';
  item = item ? item : _root;
  if ( !item ) return(-1);
  // Build pathname starting at end
  char *s = (pathname+pathnamelen-1);
  int slen = 0;			// length of string compiled so far (including NULL)
  SAFE_RCAT('\0');
  while ( item ) {
    if ( item->is_root() && showroot() == 0 ) break;		// don't include root in path if showroot() off
    // Find name of current item
    const char *name = item->label() ? item->label() : "???";	// name for this item
    int len = (int) strlen(name);
    // Add name to end of pathname[]
    for ( --len; len>=0; len-- ) {
      SAFE_RCAT(name[len]);					// rcat name of item
      if ( name[len] == '/' || name[len] == '\\' ) {
        SAFE_RCAT('\\');					// escape front or back slashes within name
      }
    }
    SAFE_RCAT('/');						// rcat leading slash
    item = item->parent();					// move up tree (NULL==root)
  }
  if ( *(++s) == '/' ) { ++s; --slen; }				// leave off leading slash from pathname
  if ( s != pathname ) memmove(pathname, s, slen);	// Shift down right-aligned string
  return(0);
}